

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

RPCHelpMan * wallet::simulaterawtransaction(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCArg> __l_01;
  initializer_list<RPCResult> __l_02;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_fffffffffffff1b8;
  allocator<RPCArg> *paVar1;
  RPCArg *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff1c0;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffff1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff1f0;
  allocator<char> *in_stack_fffffffffffff1f8;
  iterator in_stack_fffffffffffff200;
  RPCArgOptions *in_stack_fffffffffffff208;
  string *in_stack_fffffffffffff210;
  undefined7 in_stack_fffffffffffff218;
  undefined1 in_stack_fffffffffffff21f;
  undefined4 in_stack_fffffffffffff220;
  Type in_stack_fffffffffffff224;
  string *in_stack_fffffffffffff228;
  undefined4 in_stack_fffffffffffff230;
  Type in_stack_fffffffffffff234;
  undefined4 in_stack_fffffffffffff238;
  Type in_stack_fffffffffffff23c;
  RPCArg *in_stack_fffffffffffff240;
  RPCArgOptions *in_stack_fffffffffffff260;
  undefined1 *local_d88;
  undefined1 *local_d70;
  undefined1 *local_d58;
  undefined1 *local_d40;
  RPCExamples *examples;
  RPCResults *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_00;
  RPCMethodImpl *in_stack_fffffffffffff420;
  undefined1 local_bc0 [36];
  allocator<char> local_b9c;
  allocator<char> local_b9b;
  allocator<char> local_b9a [2];
  pointer local_b98;
  pointer pRStack_b90;
  pointer local_b88;
  undefined1 local_b72;
  RPCResults local_b71;
  undefined1 local_b52;
  undefined1 local_b51 [29];
  undefined1 local_b34 [2];
  allocator<char> local_b32;
  allocator<char> local_b31 [32];
  allocator<char> local_b11;
  undefined1 local_b10 [7];
  allocator<char> local_b09 [8];
  allocator<char> local_b01 [32];
  allocator<char> local_ae1 [8];
  allocator<char> local_ad9 [31];
  allocator<char> local_aba;
  allocator<char> local_ab9 [321];
  undefined1 local_978 [136];
  undefined1 local_8f0 [200];
  allocator<RPCArg> local_828 [40];
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 local_7f0;
  undefined1 local_7e8;
  undefined1 local_7e7;
  undefined1 local_7e0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined1 local_7a0;
  undefined1 local_79f;
  undefined1 local_6d8 [264];
  undefined1 local_5d0 [160];
  allocator<RPCArg> local_530 [40];
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined1 local_4f0;
  undefined1 local_4ef;
  undefined1 local_4e8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined1 local_4a8;
  undefined1 local_4a7;
  undefined1 local_400 [264];
  undefined1 local_2f8 [160];
  undefined1 local_258 [528];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
  local_ae1[1] = (allocator<char>)0x1;
  local_ae1[2] = (allocator<char>)0x0;
  local_ae1[3] = (allocator<char>)0x0;
  local_ae1[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff1c8,(Optional *)in_stack_fffffffffffff1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
  local_b09[1] = (allocator<char>)0x1;
  local_b09[2] = (allocator<char>)0x0;
  local_b09[3] = (allocator<char>)0x0;
  local_b09[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff1c8,(Optional *)in_stack_fffffffffffff1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
  local_4e8 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff1d0);
  local_4c0 = 0;
  uStack_4b8 = 0;
  local_4b0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff1b8);
  local_4a8 = 0;
  local_4a7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                 in_stack_fffffffffffff228,in_stack_fffffffffffff224,
                 (Fallback *)CONCAT17(in_stack_fffffffffffff21f,in_stack_fffffffffffff218),
                 in_stack_fffffffffffff210,in_stack_fffffffffffff208);
  std::allocator<RPCArg>::allocator(in_stack_fffffffffffff1b8);
  __l._M_len = (size_type)in_stack_fffffffffffff208;
  __l._M_array = in_stack_fffffffffffff200;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff1f8,__l,
             (allocator_type *)in_stack_fffffffffffff1f0);
  local_530[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string(in_stack_fffffffffffff1d0);
  local_508 = 0;
  uStack_500 = 0;
  local_4f8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff1b8);
  local_4f0 = 0;
  local_4ef = 0;
  paVar1 = local_530;
  RPCArg::RPCArg(in_stack_fffffffffffff240,
                 (string *)CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238),
                 in_stack_fffffffffffff234,(Fallback *)in_stack_fffffffffffff228,
                 (string *)CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_fffffffffffff21f,in_stack_fffffffffffff218),
                 in_stack_fffffffffffff260);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
  local_b10._0_4_ = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff1c8,(Optional *)in_stack_fffffffffffff1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff1c8,in_stack_fffffffffffff1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
  local_7e0 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff1d0);
  local_7b8 = 0;
  uStack_7b0 = 0;
  local_7a8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar1);
  local_7a0 = 0;
  local_79f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                 in_stack_fffffffffffff228,in_stack_fffffffffffff224,
                 (Fallback *)CONCAT17(in_stack_fffffffffffff21f,in_stack_fffffffffffff218),
                 in_stack_fffffffffffff210,in_stack_fffffffffffff208);
  this_00 = (RPCHelpMan *)local_b34;
  std::allocator<RPCArg>::allocator(paVar1);
  __l_00._M_len = (size_type)in_stack_fffffffffffff208;
  __l_00._M_array = in_stack_fffffffffffff200;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff1f8,__l_00,
             (allocator_type *)in_stack_fffffffffffff1f0);
  local_828[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string(in_stack_fffffffffffff1d0);
  local_800 = 0;
  uStack_7f8 = 0;
  local_7f0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar1);
  local_7e8 = 0;
  local_7e7 = 0;
  paVar1 = local_828;
  RPCArg::RPCArg(in_stack_fffffffffffff240,
                 (string *)CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238),
                 in_stack_fffffffffffff234,(Fallback *)in_stack_fffffffffffff228,
                 (string *)CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_fffffffffffff21f,in_stack_fffffffffffff218),
                 in_stack_fffffffffffff260);
  name = (string *)(local_b51 + 0x1c);
  std::allocator<RPCArg>::allocator(paVar1);
  __l_01._M_len = (size_type)in_stack_fffffffffffff208;
  __l_01._M_array = in_stack_fffffffffffff200;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff1f8,__l_01,
             (allocator_type *)in_stack_fffffffffffff1f0);
  description = (string *)local_b51;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
  args = (vector<RPCArg,_std::allocator<RPCArg>_> *)&local_b52;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
  results = &local_b71;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
  examples = (RPCExamples *)&local_b72;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
  local_b98 = (pointer)0x0;
  pRStack_b90 = (pointer)0x0;
  local_b88 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar1);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_fffffffffffff240,in_stack_fffffffffffff23c,
             (string *)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
             in_stack_fffffffffffff228,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220),
             (bool)in_stack_fffffffffffff21f);
  std::allocator<RPCResult>::allocator((allocator<RPCResult> *)paVar1);
  __l_02._M_len = (size_type)in_stack_fffffffffffff208;
  __l_02._M_array = (iterator)in_stack_fffffffffffff200;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff1f8,__l_02,
             (allocator_type *)in_stack_fffffffffffff1f0);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_fffffffffffff240,in_stack_fffffffffffff23c,
             (string *)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
             in_stack_fffffffffffff228,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220),
             (bool)in_stack_fffffffffffff21f);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238),
             (RPCResult *)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
  HelpExampleCli(in_stack_fffffffffffff1f0,in_stack_fffffffffffff1e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
  HelpExampleRpc(in_stack_fffffffffffff1f0,in_stack_fffffffffffff1e8);
  std::operator+(in_stack_fffffffffffff1f0,in_stack_fffffffffffff1e8);
  RPCExamples::RPCExamples((RPCExamples *)paVar1,(string *)0x9d0efe);
  this = (RPCArg *)local_bc0;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::simulaterawtransaction()::__0,void>
            (in_stack_fffffffffffff1c8,(anon_class_1_0_00000001 *)in_stack_fffffffffffff1c0);
  RPCHelpMan::RPCHelpMan(this_00,name,description,args,results,examples,in_stack_fffffffffffff420);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_bc0 + 0x23));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_b9c);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_b9b);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_b9a);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff1c8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_d40 = local_8f0;
  do {
    local_d40 = local_d40 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_d40 != local_978);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff1c8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_b72);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_b71);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_b52);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_b51);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff1c8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_d58 = local_48;
  do {
    local_d58 = local_d58 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_d58 != local_258);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff1c8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_d70 = local_5d0;
  do {
    local_d70 = local_d70 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_d70 != local_6d8);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_b34 + 1));
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_b32);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_b31);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_b11);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_b10 + 5));
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff1c8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_d88 = local_2f8;
  do {
    local_d88 = local_d88 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_d88 != local_400);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_b09);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_b01);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_ae1);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_ad9);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_aba);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_ab9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan simulaterawtransaction()
{
    return RPCHelpMan{"simulaterawtransaction",
        "\nCalculate the balance change resulting in the signing and broadcasting of the given transaction(s).\n",
        {
            {"rawtxs", RPCArg::Type::ARR, RPCArg::Optional::OMITTED, "An array of hex strings of raw transactions.\n",
                {
                    {"rawtx", RPCArg::Type::STR_HEX, RPCArg::Optional::OMITTED, ""},
                },
            },
            {"options", RPCArg::Type::OBJ_NAMED_PARAMS, RPCArg::Optional::OMITTED, "",
                {
                    {"include_watchonly", RPCArg::Type::BOOL, RPCArg::DefaultHint{"true for watch-only wallets, otherwise false"}, "Whether to include watch-only addresses (see RPC importaddress)"},
                },
            },
        },
        RPCResult{
            RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::STR_AMOUNT, "balance_change", "The wallet balance change (negative means decrease)."},
            }
        },
        RPCExamples{
            HelpExampleCli("simulaterawtransaction", "[\"myhex\"]")
            + HelpExampleRpc("simulaterawtransaction", "[\"myhex\"]")
        },
    [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> rpc_wallet = GetWalletForJSONRPCRequest(request);
    if (!rpc_wallet) return UniValue::VNULL;
    const CWallet& wallet = *rpc_wallet;

    LOCK(wallet.cs_wallet);

    UniValue include_watchonly(UniValue::VNULL);
    if (request.params[1].isObject()) {
        UniValue options = request.params[1];
        RPCTypeCheckObj(options,
            {
                {"include_watchonly", UniValueType(UniValue::VBOOL)},
            },
            true, true);

        include_watchonly = options["include_watchonly"];
    }

    isminefilter filter = ISMINE_SPENDABLE;
    if (ParseIncludeWatchonly(include_watchonly, wallet)) {
        filter |= ISMINE_WATCH_ONLY;
    }

    const auto& txs = request.params[0].get_array();
    CAmount changes{0};
    std::map<COutPoint, CAmount> new_utxos; // UTXO:s that were made available in transaction array
    std::set<COutPoint> spent;

    for (size_t i = 0; i < txs.size(); ++i) {
        CMutableTransaction mtx;
        if (!DecodeHexTx(mtx, txs[i].get_str(), /* try_no_witness */ true, /* try_witness */ true)) {
            throw JSONRPCError(RPC_DESERIALIZATION_ERROR, "Transaction hex string decoding failure.");
        }

        // Fetch previous transactions (inputs)
        std::map<COutPoint, Coin> coins;
        for (const CTxIn& txin : mtx.vin) {
            coins[txin.prevout]; // Create empty map entry keyed by prevout.
        }
        wallet.chain().findCoins(coins);

        // Fetch debit; we are *spending* these; if the transaction is signed and
        // broadcast, we will lose everything in these
        for (const auto& txin : mtx.vin) {
            const auto& outpoint = txin.prevout;
            if (spent.count(outpoint)) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Transaction(s) are spending the same output more than once");
            }
            if (new_utxos.count(outpoint)) {
                changes -= new_utxos.at(outpoint);
                new_utxos.erase(outpoint);
            } else {
                if (coins.at(outpoint).IsSpent()) {
                    throw JSONRPCError(RPC_INVALID_PARAMETER, "One or more transaction inputs are missing or have been spent already");
                }
                changes -= wallet.GetDebit(txin, filter);
            }
            spent.insert(outpoint);
        }

        // Iterate over outputs; we are *receiving* these, if the wallet considers
        // them "mine"; if the transaction is signed and broadcast, we will receive
        // everything in these
        // Also populate new_utxos in case these are spent in later transactions

        const auto& hash = mtx.GetHash();
        for (size_t i = 0; i < mtx.vout.size(); ++i) {
            const auto& txout = mtx.vout[i];
            bool is_mine = 0 < (wallet.IsMine(txout) & filter);
            changes += new_utxos[COutPoint(hash, i)] = is_mine ? txout.nValue : 0;
        }
    }

    UniValue result(UniValue::VOBJ);
    result.pushKV("balance_change", ValueFromAmount(changes));

    return result;
}
    };
}